

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int async_func_init(JSContext *ctx,JSAsyncFunctionState *s,JSValue func_obj,JSValue this_obj,
                   int argc,JSValue *argv)

{
  list_head *plVar1;
  ushort uVar2;
  int *piVar3;
  undefined8 uVar4;
  JSValue *pJVar5;
  long lVar6;
  long lVar7;
  JSValueUnion JVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  JSValueUnion JVar12;
  JSRefCountHeader *p;
  
  JVar12 = this_obj.u;
  JVar8 = func_obj.u;
  plVar1 = &(s->frame).var_ref_list;
  (s->frame).var_ref_list.prev = plVar1;
  (s->frame).var_ref_list.next = plVar1;
  lVar7 = *(long *)((long)JVar8.ptr + 0x30);
  (s->frame).js_mode = (uint)*(byte *)(lVar7 + 0x18);
  (s->frame).cur_pc = *(uint8_t **)(lVar7 + 0x20);
  uVar10 = (uint)*(ushort *)(lVar7 + 0x40);
  if ((int)(uint)*(ushort *)(lVar7 + 0x40) <= argc) {
    uVar10 = argc;
  }
  iVar11 = *(ushort *)(lVar7 + 0x42) + uVar10;
  pJVar5 = (JSValue *)
           js_malloc(ctx,(ulong)(iVar11 + (uint)*(ushort *)(lVar7 + 0x46) +
                                (uint)(iVar11 + (uint)*(ushort *)(lVar7 + 0x46) == 0)) << 4);
  (s->frame).arg_buf = pJVar5;
  if (pJVar5 == (JSValue *)0x0) {
    iVar11 = -1;
  }
  else {
    if (0xfffffff4 < (uint)func_obj.tag) {
      *(int *)JVar8.ptr = *JVar8.ptr + 1;
    }
    (s->frame).cur_func.u.ptr = (void *)JVar8;
    (s->frame).cur_func.tag = func_obj.tag;
    if (0xfffffff4 < (uint)this_obj.tag) {
      *(int *)JVar12.ptr = *JVar12.ptr + 1;
    }
    (s->this_val).u.ptr = (void *)JVar12;
    (s->this_val).tag = this_obj.tag;
    s->argc = argc;
    (s->frame).arg_count = uVar10;
    (s->frame).var_buf = pJVar5 + uVar10;
    (s->frame).cur_sp = pJVar5 + uVar10 + *(ushort *)(lVar7 + 0x42);
    lVar6 = 0;
    uVar9 = 0;
    if (0 < argc) {
      uVar9 = (ulong)(uint)argc;
    }
    for (; uVar9 * 0x10 != lVar6; lVar6 = lVar6 + 0x10) {
      pJVar5 = (s->frame).arg_buf;
      piVar3 = *(int **)((long)&argv->u + lVar6);
      uVar4 = *(undefined8 *)((long)&argv->tag + lVar6);
      if (0xfffffff4 < (uint)uVar4) {
        *piVar3 = *piVar3 + 1;
      }
      *(int **)((long)&pJVar5->u + lVar6) = piVar3;
      *(undefined8 *)((long)&pJVar5->tag + lVar6) = uVar4;
    }
    uVar2 = *(ushort *)(lVar7 + 0x42);
    lVar7 = (long)argc;
    uVar9 = lVar7 << 4 | 8;
    for (; lVar7 < (long)(ulong)(uVar10 + uVar2); lVar7 = lVar7 + 1) {
      pJVar5 = (s->frame).arg_buf;
      *(undefined4 *)((long)pJVar5 + (uVar9 - 8)) = 0;
      *(undefined8 *)((long)&pJVar5->u + uVar9) = 3;
      uVar9 = uVar9 + 0x10;
    }
    iVar11 = 0;
  }
  return iVar11;
}

Assistant:

static __exception int async_func_init(JSContext *ctx, JSAsyncFunctionState *s,
                                       JSValueConst func_obj, JSValueConst this_obj,
                                       int argc, JSValueConst *argv)
{
    JSObject *p;
    JSFunctionBytecode *b;
    JSStackFrame *sf;
    int local_count, i, arg_buf_len, n;

    sf = &s->frame;
    init_list_head(&sf->var_ref_list);
    p = JS_VALUE_GET_OBJ(func_obj);
    b = p->u.func.function_bytecode;
    sf->js_mode = b->js_mode;
    sf->cur_pc = b->byte_code_buf;
    arg_buf_len = max_int(b->arg_count, argc);
    local_count = arg_buf_len + b->var_count + b->stack_size;
    sf->arg_buf = js_malloc(ctx, sizeof(JSValue) * max_int(local_count, 1));
    if (!sf->arg_buf)
        return -1;
    sf->cur_func = JS_DupValue(ctx, func_obj);
    s->this_val = JS_DupValue(ctx, this_obj);
    s->argc = argc;
    sf->arg_count = arg_buf_len;
    sf->var_buf = sf->arg_buf + arg_buf_len;
    sf->cur_sp = sf->var_buf + b->var_count;
    for(i = 0; i < argc; i++)
        sf->arg_buf[i] = JS_DupValue(ctx, argv[i]);
    n = arg_buf_len + b->var_count;
    for(i = argc; i < n; i++)
        sf->arg_buf[i] = JS_UNDEFINED;
    return 0;
}